

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableUpdateDrawChannels(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ImS8 IVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  bool bVar8;
  
  iVar3 = 1;
  if ((table->Flags & 0x4000) == 0) {
    iVar3 = table->ColumnsVisibleCount;
  }
  bVar8 = true;
  if (table->ColumnsCount <= table->ColumnsVisibleCount) {
    bVar8 = table->VisibleUnclippedMaskByIndex != table->VisibleMaskByIndex;
  }
  iVar4 = iVar3 << ('\0' < table->FreezeRowsCount);
  ImDrawListSplitter::Split
            (&table->DrawSplitter,table->InnerWindow->DrawList,iVar4 + (uint)bVar8 + 1);
  IVar2 = -1;
  if (bVar8 != false) {
    IVar2 = (char)iVar4 + bVar8;
  }
  table->DummyDrawChannel = IVar2;
  if (0 < table->ColumnsCount) {
    cVar6 = '\x01';
    lVar7 = 0;
    lVar5 = 0;
    do {
      pIVar1 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&(pIVar1->ClipRect).Min.x + lVar7))
      {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                    ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
      }
      if ((&pIVar1->IsClipped)[lVar7] == false) {
        (&pIVar1->DrawChannelRowsBeforeFreeze)[lVar7] = cVar6;
        iVar4 = 0;
        if ('\0' < table->FreezeRowsCount) {
          iVar4 = iVar3;
        }
        (&pIVar1->DrawChannelRowsAfterFreeze)[lVar7] = (char)iVar4 + cVar6;
        cVar6 = cVar6 + ((table->Flags & 0x4000) == 0);
      }
      else {
        IVar2 = table->DummyDrawChannel;
        (&pIVar1->DrawChannelRowsAfterFreeze)[lVar7] = IVar2;
        (&pIVar1->DrawChannelRowsBeforeFreeze)[lVar7] = IVar2;
      }
      (&pIVar1->DrawChannelCurrent)[lVar7] = (&pIVar1->DrawChannelRowsBeforeFreeze)[lVar7];
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x68;
    } while (lVar5 < table->ColumnsCount);
  }
  return;
}

Assistant:

void ImGui::TableUpdateDrawChannels(ImGuiTable* table)
{
    // Allocate draw channels.
    // - We allocate them following storage order instead of display order so reordering columns won't needlessly
    //   increase overall dormant memory cost.
    // - We isolate headers draw commands in their own channels instead of just altering clip rects.
    //   This is in order to facilitate merging of draw commands.
    // - After crossing FreezeRowsCount, all columns see their current draw channel changed to a second set of channels.
    // - We only use the dummy draw channel so we can push a null clipping rectangle into it without affecting other
    //   channels, while simplifying per-row/per-cell overhead. It will be empty and discarded when merged.
    // Draw channel allocation (before merging):
    // - NoClip                       --> 1+1 channels: background + foreground (same clip rect == 1 draw call)
    // - Clip                         --> 1+N channels
    // - FreezeRows || FreezeColumns  --> 1+N*2 (unless scrolling value is zero)
    // - FreezeRows && FreezeColunns  --> 2+N*2 (unless scrolling value is zero)
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClipX) ? 1 : table->ColumnsVisibleCount;
    const int channels_for_background = 1;
    const int channels_for_dummy = (table->ColumnsVisibleCount < table->ColumnsCount || table->VisibleUnclippedMaskByIndex != table->VisibleMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_background + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = channels_for_dummy ? (ImS8)(channels_total - 1) : -1;

    int draw_channel_current = 1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsClipped)
        {
            column->DrawChannelRowsBeforeFreeze = (ImS8)(draw_channel_current);
            column->DrawChannelRowsAfterFreeze = (ImS8)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClipX))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelRowsBeforeFreeze = column->DrawChannelRowsAfterFreeze = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelRowsBeforeFreeze;
    }
}